

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_Expressions.cpp
# Opt level: O0

uint8_t precedenceOf(SyntaxKind tkK)

{
  uint8_t local_9;
  SyntaxKind tkK_local;
  
  switch(tkK) {
  case AsteriskToken:
  case SlashToken:
  case PercentToken:
    local_9 = '\r';
    break;
  case AmpersandToken:
    local_9 = '\b';
    break;
  case PlusToken:
  case MinusToken:
    local_9 = '\f';
    break;
  default:
    local_9 = '\0';
    break;
  case LessThanLessThanToken:
  case GreaterThanGreaterThanToken:
    local_9 = '\v';
    break;
  case BarToken:
    local_9 = '\x06';
    break;
  case CaretToken:
    local_9 = '\a';
    break;
  case AmpersandAmpersandToken:
    local_9 = '\x05';
    break;
  case BarBarToken:
    local_9 = '\x04';
    break;
  case LessThanToken:
  case LessThanEqualsToken:
  case GreaterThanToken:
  case GreaterThanEqualsToken:
    local_9 = '\n';
    break;
  case EqualsEqualsToken:
  case ExclamationEqualsToken:
    local_9 = '\t';
    break;
  case QuestionToken:
    local_9 = '\x03';
    break;
  case EqualsToken:
  case AsteriskEqualsToken:
  case SlashEqualsToken:
  case PercentEqualsToken:
  case PlusEqualsToken:
  case MinusEqualsToken:
  case LessThanLessThanEqualsToken:
  case GreaterThanGreaterThanEqualsToken:
  case AmpersandEqualsToken:
  case CaretEqualsToken:
  case BarEqualsToken:
    local_9 = '\x02';
    break;
  case CommaToken:
    local_9 = '\x01';
  }
  return local_9;
}

Assistant:

std::uint8_t precedenceOf(SyntaxKind tkK)
{
    switch (tkK) {
        case SyntaxKind::CommaToken:
            return NAryPrecedence::Sequencing;

        case SyntaxKind::EqualsToken:
        case SyntaxKind::PlusEqualsToken:
        case SyntaxKind::MinusEqualsToken:
        case SyntaxKind::AsteriskEqualsToken:
        case SyntaxKind::SlashEqualsToken:
        case SyntaxKind::PercentEqualsToken:
        case SyntaxKind::LessThanLessThanEqualsToken:
        case SyntaxKind::GreaterThanGreaterThanEqualsToken:
        case SyntaxKind::AmpersandEqualsToken:
        case SyntaxKind::CaretEqualsToken:
        case SyntaxKind::BarEqualsToken:
            return NAryPrecedence::Assignment;

        case SyntaxKind::QuestionToken:
            return NAryPrecedence::Conditional;

        case SyntaxKind::BarBarToken:
            return NAryPrecedence::LogicalOR;

        case SyntaxKind::AmpersandAmpersandToken:
            return NAryPrecedence::LogicalAND;

        case SyntaxKind::BarToken:
            return NAryPrecedence::BitwiseOR;

        case SyntaxKind::CaretToken:
            return NAryPrecedence::BitwiseXOR;

        case SyntaxKind::AmpersandToken:
            return NAryPrecedence::BitwiseAND;

        case SyntaxKind::EqualsEqualsToken:
        case SyntaxKind::ExclamationEqualsToken:
            return NAryPrecedence::Equality;

        case SyntaxKind::GreaterThanToken:
        case SyntaxKind::LessThanToken:
        case SyntaxKind::LessThanEqualsToken:
        case SyntaxKind::GreaterThanEqualsToken:
            return NAryPrecedence::Relational;

        case SyntaxKind::LessThanLessThanToken:
        case SyntaxKind::GreaterThanGreaterThanToken:
            return NAryPrecedence::Shift;

        case SyntaxKind::PlusToken:
        case SyntaxKind::MinusToken:
            return NAryPrecedence::Additive;

        case SyntaxKind::AsteriskToken:
        case SyntaxKind::SlashToken:
        case SyntaxKind::PercentToken:
            return NAryPrecedence::Multiplicative;

        default:
            return NAryPrecedence::Undefined;
    }
}